

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::UpsampleLayerParams::UpsampleLayerParams
          (UpsampleLayerParams *this,UpsampleLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__UpsampleLayerParams_00724d70;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->scalingfactor_).current_size_ = 0;
  (this->scalingfactor_).total_size_ = 0;
  (this->scalingfactor_).rep_ = (Rep *)0x0;
  iVar1 = (from->scalingfactor_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->scalingfactor_,iVar1);
    memcpy(((this->scalingfactor_).rep_)->elements,((from->scalingfactor_).rep_)->elements,
           (long)(from->scalingfactor_).current_size_ << 3);
    (this->scalingfactor_).current_size_ = (from->scalingfactor_).current_size_;
  }
  (this->fractionalscalingfactor_).current_size_ = 0;
  (this->fractionalscalingfactor_).total_size_ = 0;
  (this->fractionalscalingfactor_).rep_ = (Rep *)0x0;
  iVar1 = (from->fractionalscalingfactor_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<float>::Reserve(&this->fractionalscalingfactor_,iVar1);
    memcpy(((this->fractionalscalingfactor_).rep_)->elements,
           ((from->fractionalscalingfactor_).rep_)->elements,
           (long)(from->fractionalscalingfactor_).current_size_ << 2);
    (this->fractionalscalingfactor_).current_size_ = (from->fractionalscalingfactor_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar1 = from->linearupsamplemode_;
  this->mode_ = from->mode_;
  this->linearupsamplemode_ = iVar1;
  return;
}

Assistant:

UpsampleLayerParams::UpsampleLayerParams(const UpsampleLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      scalingfactor_(from.scalingfactor_),
      fractionalscalingfactor_(from.fractionalscalingfactor_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&mode_, &from.mode_,
    reinterpret_cast<char*>(&linearupsamplemode_) -
    reinterpret_cast<char*>(&mode_) + sizeof(linearupsamplemode_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.UpsampleLayerParams)
}